

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesPathWidget.cxx
# Opt level: O0

void __thiscall
cmCursesPathWidget::cmCursesPathWidget
          (cmCursesPathWidget *this,int width,int height,int left,int top)

{
  int top_local;
  int left_local;
  int height_local;
  int width_local;
  cmCursesPathWidget *this_local;
  
  cmCursesStringWidget::cmCursesStringWidget
            (&this->super_cmCursesStringWidget,width,height,left,top);
  (this->super_cmCursesStringWidget).super_cmCursesWidget._vptr_cmCursesWidget =
       (_func_int **)&PTR__cmCursesPathWidget_00a779e0;
  std::__cxx11::string::string((string *)&this->LastString);
  std::__cxx11::string::string((string *)&this->LastGlob);
  (this->super_cmCursesStringWidget).super_cmCursesWidget.Type = PATH;
  this->Cycle = false;
  this->CurrentIndex = 0;
  return;
}

Assistant:

cmCursesPathWidget::cmCursesPathWidget(int width, int height,
                                           int left, int top) :
  cmCursesStringWidget(width, height, left, top)
{
  this->Type = cmState::PATH;
  this->Cycle = false;
  this->CurrentIndex = 0;
}